

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O2

void TestFastDtoaShortestVariousDoubles(void)

{
  bool bVar1;
  undefined1 uVar2;
  int requested_digits;
  int *piVar5;
  int *piVar6;
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  int *in_stack_ffffffffffffff58;
  int point;
  int length;
  char buffer_container [100];
  int *piVar3;
  int *piVar4;
  
  piVar4 = &length;
  piVar6 = &point;
  uVar2 = 100;
  buffer._8_8_ = piVar4;
  buffer.start_ = (char *)0x64;
  requested_digits = (int)buffer_container;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,4.94065645841247e-324,FAST_DTOA_SHORTEST,
                     requested_digits,buffer,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x41,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x42,0xc0ce76,"5",buffer_container,(char *)piVar3,(char *)piVar5);
  CheckEqualsHelper((char *)0x43,0xc0ce7a,(char *)0xfffffebd,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_00._8_8_ = piVar4;
  buffer_00.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,1.79769313486232e+308,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_00,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x48,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x49,0xc0ceb2,"17976931348623157",buffer_container,(char *)piVar3,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x4a,0xa6153b,(char *)0x135,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_01._8_8_ = piVar4;
  buffer_01.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,4294967272.0,FAST_DTOA_SHORTEST,requested_digits,
                     buffer_01,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x4e,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x4f,0xc0cefa,"4294967272",buffer_container,(char *)piVar3,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x50,0xc0df44,(char *)0xa,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_02._8_8_ = piVar4;
  buffer_02.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,4.185580496821357e+298,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_02,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x54,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x55,0xc0cf45,"4185580496821357",buffer_container,(char *)piVar3,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x56,0xaf8c1d,(char *)0x12b,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_03._8_8_ = piVar4;
  buffer_03.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,5.562684646268003e-309,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_03,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x5a,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x5b,0xc0cfa6,"5562684646268003",buffer_container,(char *)piVar3,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x5c,0xc1fb9c,(char *)0xfffffecc,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_04._8_8_ = piVar4;
  buffer_04.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,2147483648.0,FAST_DTOA_SHORTEST,requested_digits,
                     buffer_04,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x60,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x61,0xc0cfde,"2147483648",buffer_container,(char *)piVar3,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x62,0xc0df44,(char *)0xa,point,(char *)piVar3,(int)piVar5);
  buffer_05._8_8_ = piVar4;
  buffer_05.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,3.5844466002796428e+298,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_05,piVar6,in_stack_ffffffffffffff58);
  if (bVar1) {
    CheckEqualsHelper((char *)0x67,0xc0d016,"35844466002796428",buffer_container,(char *)piVar4,
                      (char *)piVar6);
    CheckEqualsHelper((char *)0x68,0xaf8c1d,(char *)0x12b,point,(char *)piVar4,(int)piVar6);
  }
  piVar4 = &length;
  piVar6 = &point;
  buffer_06._8_8_ = piVar4;
  buffer_06.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,2.2250738585072014e-308,FAST_DTOA_SHORTEST,
                     (int)buffer_container,buffer_06,piVar6,in_stack_ffffffffffffff58);
  if (bVar1) {
    CheckEqualsHelper((char *)0x6f,0xc0d050,"22250738585072014",buffer_container,(char *)piVar4,
                      (char *)piVar6);
    CheckEqualsHelper((char *)0x70,0xc0d076,(char *)0xfffffecd,point,(char *)piVar4,(int)piVar6);
  }
  piVar4 = &length;
  piVar6 = &point;
  buffer_07._8_8_ = piVar4;
  buffer_07.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,2.225073858507201e-308,FAST_DTOA_SHORTEST,
                     (int)buffer_container,buffer_07,piVar6,in_stack_ffffffffffffff58);
  if (bVar1) {
    CheckEqualsHelper((char *)0x77,0xc0d0a7,"2225073858507201",buffer_container,(char *)piVar4,
                      (char *)piVar6);
    CheckEqualsHelper((char *)0x78,0xc0d076,(char *)0xfffffecd,point,(char *)piVar4,(int)piVar6);
  }
  return;
}

Assistant:

TEST(FastDtoaShortestVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  double min_double = 5e-324;
  status = FastDtoa(min_double, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("5", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  status = FastDtoa(max_double, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("17976931348623157", buffer.start());
  CHECK_EQ(309, point);

  status = FastDtoa(4294967272.0, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(4.1855804968213567e298, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("4185580496821357", buffer.start());
  CHECK_EQ(299, point);

  status = FastDtoa(5.5626846462680035e-309, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("5562684646268003", buffer.start());
  CHECK_EQ(-308, point);

  status = FastDtoa(2147483648.0, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.5844466002796428e+298, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  if (status) {  // Not all FastDtoa variants manage to compute this number.
    CHECK_EQ("35844466002796428", buffer.start());
    CHECK_EQ(299, point);
  }

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("22250738585072014", buffer.start());
    CHECK_EQ(-307, point);
  }

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("2225073858507201", buffer.start());
    CHECK_EQ(-307, point);
  }
}